

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool cmQtAutoGenerator::FileWrite(string *filename,string *content,string *error)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  _Ios_Openmode __a;
  anon_class_24_3_208d98c2 local_250;
  undefined1 local_228 [8];
  ofstream ofs;
  string *error_local;
  string *content_local;
  string *filename_local;
  
  ofs._504_8_ = error;
  bVar1 = MakeParentDirectory(filename);
  if (bVar1) {
    std::ofstream::ofstream(local_228);
    _Var2 = std::__cxx11::string::c_str();
    __a = std::operator|(_S_out,_S_bin);
    std::operator|(__a,_S_trunc);
    std::ofstream::open(local_228,_Var2);
    local_250.ofs = (ofstream *)local_228;
    local_250.error = (string *)ofs._504_8_;
    local_250.content = content;
    filename_local._7_1_ = FileWrite::anon_class_24_3_208d98c2::operator()(&local_250);
    std::ofstream::~ofstream(local_228);
  }
  else {
    if (ofs._504_8_ != 0) {
      std::__cxx11::string::operator=((string *)ofs._504_8_,"Could not create parent directory.");
    }
    filename_local._7_1_ = false;
  }
  return filename_local._7_1_;
}

Assistant:

bool cmQtAutoGenerator::FileWrite(std::string const& filename,
                                  std::string const& content,
                                  std::string* error)
{
  // Make sure the parent directory exists
  if (!cmQtAutoGenerator::MakeParentDirectory(filename)) {
    if (error != nullptr) {
      *error = "Could not create parent directory.";
    }
    return false;
  }
  cmsys::ofstream ofs;
  ofs.open(filename.c_str(),
           (std::ios::out | std::ios::binary | std::ios::trunc));

  // Use lambda to save destructor calls of ofs
  return [&ofs, &content, error]() -> bool {
    if (!ofs) {
      if (error != nullptr) {
        *error = "Opening file for writing failed.";
      }
      return false;
    }
    ofs << content;
    if (!ofs.good()) {
      if (error != nullptr) {
        *error = "File writing failed.";
      }
      return false;
    }
    return true;
  }();
}